

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB.cpp
# Opt level: O2

ErrorCode PDB::ValidateFile(void *data)

{
  int iVar1;
  ErrorCode EVar2;
  
  iVar1 = bcmp(data,"Microsoft C/C++ MSF 7.00\r\n\x1aDS",0x1e);
  if (iVar1 == 0) {
    EVar2 = (uint)(1 < *(int *)((long)data + 0x24) - 1U) * 2;
  }
  else {
    EVar2 = InvalidSuperBlock;
  }
  return EVar2;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::ValidateFile(const void* data) PDB_NO_EXCEPT
{
	// validate the super block
	const SuperBlock* superBlock = Pointer::Offset<const SuperBlock*>(data, 0u);
	{
		// validate header magic
		if (std::memcmp(superBlock->fileMagic, SuperBlock::MAGIC, sizeof(SuperBlock::MAGIC)) != 0)
		{
			return ErrorCode::InvalidSuperBlock;
		}

		// validate free block map.
		// the free block map should always reside at either index 1 or 2.
		if (superBlock->freeBlockMapIndex != 1u && superBlock->freeBlockMapIndex != 2u)
		{
			return ErrorCode::InvalidFreeBlockMap;
		}
	}

	return ErrorCode::Success;
}